

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packer.cpp
# Opt level: O2

void __thiscall CPacker::AddInt(CPacker *this,int i)

{
  uchar *puVar1;
  
  if (this->m_Error != 0) {
    return;
  }
  if ((long)this->m_pEnd - (long)this->m_pCurrent < 6) {
    dbg_break();
    this->m_Error = 1;
  }
  else {
    puVar1 = CVariableInt::Pack(this->m_pCurrent,i);
    this->m_pCurrent = puVar1;
  }
  return;
}

Assistant:

void CPacker::AddInt(int i)
{
	if(m_Error)
		return;

	// make sure that we have space enough
	if(m_pEnd - m_pCurrent <= CVariableInt::MAX_BYTES_PACKED)
	{
		dbg_break();
		m_Error = 1;
	}
	else
		m_pCurrent = CVariableInt::Pack(m_pCurrent, i);
}